

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

RegNum __thiscall
LinearScan::Spill(LinearScan *this,Lifetime *newLifetime,RegOpnd *regOpnd,bool dontSpillCurrent,
                 bool force)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  code *pcVar4;
  undefined1 auVar5 [8];
  SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *pSVar6;
  bool bVar7;
  BOOLEAN BVar8;
  RegNum RVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined4 *puVar13;
  Type *ppLVar14;
  Type pLVar15;
  undefined1 auStack_a0 [8];
  EditingIterator iter;
  undefined1 auStack_68 [8];
  EditingIterator candidate;
  BVUnitT<unsigned_long> local_40;
  BitVector intUsageBV;
  
  if (regOpnd == (RegOpnd *)0x0 || newLifetime == (Lifetime *)0x0) {
    local_40.word = 0;
    if (newLifetime != (Lifetime *)0x0) goto LAB_005362dc;
    intUsageBV.word._0_4_ = 1;
    uVar11 = 0xffffffff;
    if ((byte)((regOpnd->super_Opnd).m_type - TyFloat32) < 2) {
      intUsageBV.word._4_4_ = 0;
    }
    else {
      bVar7 = IR::Opnd::IsSimd128(&regOpnd->super_Opnd);
      intUsageBV.word._4_4_ = 0;
      if (!bVar7) {
        local_40.word = 0;
        BVUnitT<unsigned_long>::Set(&local_40,TySize[(regOpnd->super_Opnd).m_type]);
        intUsageBV.word._0_4_ = 0;
      }
    }
  }
  else {
    uVar3 = *(uint *)&newLifetime->field_0x9c;
    if ((regOpnd->super_Opnd).m_type == TyFloat64) {
      uVar10 = 1;
    }
    else {
      bVar7 = IR::Opnd::IsSimd128(&regOpnd->super_Opnd);
      uVar10 = (uint)bVar7;
    }
    if (uVar10 != (uVar3 >> 0xd & 1)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar13 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0xac1,
                         "(!newLifetime || !regOpnd || newLifetime->isFloat == (regOpnd->GetType() == TyMachDouble || regOpnd->IsSimd128()))"
                         ,
                         "!newLifetime || !regOpnd || newLifetime->isFloat == (regOpnd->GetType() == TyMachDouble || regOpnd->IsSimd128())"
                        );
      if (!bVar7) goto LAB_0053654a;
      *puVar13 = 0;
    }
LAB_005362dc:
    uVar1 = *(ushort *)&newLifetime->field_0x9c;
    if (force) {
      uVar11 = 0xffffffff;
      uVar2 = uVar1;
    }
    else {
      uVar11 = GetSpillCost(this,newLifetime);
      uVar2 = *(ushort *)&newLifetime->field_0x9c;
    }
    local_40.word = (newLifetime->intUsageBv).word;
    intUsageBV.word._0_4_ = uVar1 >> 0xd & 1;
    intUsageBV.word._4_4_ = (uVar2 & 4) >> 2;
  }
  candidate.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
  auStack_68 = (undefined1  [8])0x0;
  candidate.super_EditingIterator.super_Iterator.list =
       (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  auStack_a0 = (undefined1  [8])this->activeLiveranges;
  iter.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
  iter.super_EditingIterator.last = (NodeBase *)&this->instrUseRegs;
  iter.super_EditingIterator.super_Iterator.list =
       (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)auStack_a0;
LAB_00536368:
  bVar7 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                    ((EditingIterator *)auStack_a0);
  pSVar6 = candidate.super_EditingIterator.super_Iterator.list;
  auVar5 = auStack_68;
  if (bVar7) {
    ppLVar14 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)auStack_a0);
    uVar12 = GetSpillCost(this,*ppLVar14);
    if ((uVar12 < uVar11) &&
       (BVar8 = BVUnitT<unsigned_long>::Test
                          ((BVUnitT<unsigned_long> *)iter.super_EditingIterator.last,
                           (uint)(*ppLVar14)->reg), BVar8 == '\0')) {
      pLVar15 = *ppLVar14;
      if ((-1 < (char)*(uint *)&pLVar15->field_0x9c) &&
         ((uint)intUsageBV.word == (*(uint *)&pLVar15->field_0x9c >> 0xd & 1))) {
        if (intUsageBV.word._4_1_ != '\0') {
          BVar8 = BVUnitT<unsigned_long>::Test(&this->calleeSavedRegs,(uint)pLVar15->reg);
          if (BVar8 == '\0') goto LAB_00536368;
          pLVar15 = *ppLVar14;
        }
        bVar7 = LinearScanMD::FitRegIntSizeConstraints
                          (&this->linearScanMD,pLVar15->reg,(BitVector)local_40.word);
        if (bVar7) {
          candidate.super_EditingIterator.super_Iterator.current =
               iter.super_EditingIterator.super_Iterator.current;
          auStack_68 = auStack_a0;
          candidate.super_EditingIterator.super_Iterator.list =
               iter.super_EditingIterator.super_Iterator.list;
          uVar11 = uVar12;
        }
      }
    }
    goto LAB_00536368;
  }
  if ((newLifetime == (Lifetime *)0x0) &&
     (candidate.super_EditingIterator.super_Iterator.list ==
      (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0 ||
      (undefined1  [8])candidate.super_EditingIterator.super_Iterator.list == auStack_68)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar13 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xaf1,"(newLifetime || candidate.IsValid())",
                       "Didn\'t find anything to spill?!?");
    if (!bVar7) {
LAB_0053654a:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar13 = 0;
  }
  if ((pSVar6 == (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0) ||
     ((undefined1  [8])pSVar6 == auVar5)) {
    if (dontSpillCurrent) {
      return RegNOREG;
    }
  }
  else {
    ppLVar14 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)auStack_68);
    newLifetime = *ppLVar14;
    SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::RemoveCurrent
              ((EditingIterator *)auStack_68);
    BVUnitT<unsigned_long>::Clear(&this->activeRegs,(uint)newLifetime->reg);
    if ((newLifetime->field_0x9d & 0x20) == 0) {
      this->intRegUsedCount = this->intRegUsedCount - 1;
    }
    else {
      this->floatRegUsedCount = this->floatRegUsedCount - 1;
    }
  }
  RVar9 = SpillLiveRange(this,newLifetime,(Instr *)0x0);
  return RVar9;
}

Assistant:

RegNum
LinearScan::Spill(Lifetime *newLifetime, IR::RegOpnd *regOpnd, bool dontSpillCurrent, bool force)
{
    uint minSpillCost = (uint)-1;

    Assert(!newLifetime || !regOpnd || newLifetime->isFloat == (regOpnd->GetType() == TyMachDouble || regOpnd->IsSimd128()));
    bool isFloatReg;
    BitVector intUsageBV;
    bool needCalleeSaved;

    // For now, we just spill the lifetime with the lowest spill cost.
    if (newLifetime)
    {
        isFloatReg = newLifetime->isFloat;

        if (!force)
        {
            minSpillCost = this->GetSpillCost(newLifetime);
        }
        intUsageBV = newLifetime->intUsageBv;
        needCalleeSaved = newLifetime->isLiveAcrossUserCalls;
    }
    else
    {
        needCalleeSaved = false;
        if (regOpnd->IsFloat() || regOpnd->IsSimd128())
        {
            isFloatReg = true;
        }
        else
        {
            // Filter for int reg size constraints
            isFloatReg = false;
            intUsageBV.ClearAll();
            intUsageBV.Set(TySize[regOpnd->GetType()]);
        }
    }

    SList<Lifetime *>::EditingIterator candidate;
    FOREACH_SLIST_ENTRY_EDITING(Lifetime *, lifetime, this->activeLiveranges, iter)
    {
        uint spillCost = this->GetSpillCost(lifetime);
        if (spillCost < minSpillCost                        &&
            this->instrUseRegs.Test(lifetime->reg) == false &&
            lifetime->isFloat == isFloatReg &&
            !lifetime->cantSpill                            &&
            (!needCalleeSaved || this->calleeSavedRegs.Test(lifetime->reg)) &&
            this->linearScanMD.FitRegIntSizeConstraints(lifetime->reg, intUsageBV))
        {
            minSpillCost = spillCost;
            candidate = iter;
        }
    } NEXT_SLIST_ENTRY_EDITING;
    AssertMsg(newLifetime || candidate.IsValid(), "Didn't find anything to spill?!?");

    Lifetime * spilledRange;
    if (candidate.IsValid())
    {
        spilledRange = candidate.Data();
        candidate.RemoveCurrent();

        this->activeRegs.Clear(spilledRange->reg);
        if (spilledRange->IsInt())
        {
            this->intRegUsedCount--;
        }
        else
        {
            this->floatRegUsedCount--;
        }
    }
    else if (dontSpillCurrent)
    {
        return RegNOREG;
    }
    else
    {
        spilledRange = newLifetime;
    }

    return this->SpillLiveRange(spilledRange);
}